

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pace.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar5;
  undefined8 *puVar6;
  ulong uVar7;
  size_type *psVar8;
  long *plVar9;
  int iVar10;
  size_t sVar11;
  int i;
  uint uVar12;
  size_t sVar13;
  ListGraph g;
  string input_file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  undefined1 local_4a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  ListGraph local_480;
  string local_450;
  string local_430;
  string local_410;
  int local_3ec;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_378;
  PierceRating local_368;
  string local_360;
  ArrayIDIDFunc local_340;
  undefined8 local_328;
  ArrayIDIDFunc local_320;
  ArrayIDIDFunc local_308;
  ArrayIDIDFunc local_2f0;
  ArrayIDIDFunc local_2d8;
  ArrayIDIDFunc local_2c0;
  ArrayIDIDFunc local_2a8;
  ArrayIDIDFunc local_290;
  ArrayIDIDFunc local_278;
  ArrayIDIDFunc local_260;
  ArrayIDIDFunc local_248;
  ArrayIDIDFunc local_230;
  ArrayIDIDFunc local_218;
  ArrayIDIDFunc local_200;
  ArrayIDIDFunc local_1e8;
  ArrayIDIDFunc local_1d0;
  ArrayIDIDFunc local_1b8;
  ArrayIDIDFunc local_1a0;
  ArrayIDIDFunc local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  signal(0xf,signal_handler);
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  local_388._0_8_ = &aStack_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"-","");
  if (argc < 2) {
    uVar7 = 0;
  }
  else {
    local_328 = 0;
    local_3ec = argc + -1;
    iVar10 = 1;
    do {
      pcVar2 = argv[iVar10];
      iVar4 = strcmp(pcVar2,"--help");
      if ((iVar4 == 0) ||
         (((cVar1 = *pcVar2, cVar1 == '-' && (pcVar2[1] == 'h')) && (pcVar2[2] == '\0')))) {
        write(2,
              "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n  -h,--help Print this message and do nothing else\n  --status  Print a message to stderr each time a\n            better tree depth decomposition is found\n  --verbose Print a message to stderr each time a tree\n            depth decomposition was computed independent\n            of whether it is better than the best one \n            found so far\n  -i <file> Instead of reading the graph from stdin,\n            read it from <file>\n  -s <seed> Use <seed> as seed for the random number\n            generator. This must be an integer. The\n            default seed is 0.\n"
              ,0x360);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._0_8_ != &aStack_378) {
          operator_delete((void *)local_388._0_8_);
        }
        return 1;
      }
      iVar4 = strcmp(pcVar2,"--verbose");
      if (iVar4 == 0) {
        print_verbose_status = true;
        print_status = true;
      }
      else {
        iVar4 = strcmp(pcVar2,"--status");
        uVar3 = local_388._8_8_;
        if (iVar4 == 0) {
          print_status = true;
        }
        else if (cVar1 == '-') {
          if ((pcVar2[1] == 'i') && (pcVar2[2] == '\0' && iVar10 != local_3ec)) {
            pcVar2 = argv[(long)iVar10 + 1];
            strlen(pcVar2);
            std::__cxx11::string::_M_replace((ulong)local_388,0,(char *)uVar3,(ulong)pcVar2);
            iVar10 = iVar10 + 1;
          }
          else if ((pcVar2[1] == 's') && (pcVar2[2] == '\0' && iVar10 != local_3ec)) {
            iVar4 = atoi(argv[(long)iVar10 + 1]);
            local_328 = CONCAT44(extraout_var,iVar4);
            iVar10 = iVar10 + 1;
          }
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < argc);
    uVar7 = (ulong)(long)(int)local_328 % 0x7fffffff;
  }
  load_uncached_text_file<ListGraph(std::istream&)>
            (&local_480,(string *)local_388,load_pace_graph_impl);
  if (tail.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(tail.super_ArrayIDFunc<int>.data_);
  }
  tail.super_ArrayIDFunc<int>.preimage_count_ =
       local_480.tail.super_ArrayIDFunc<int>.preimage_count_;
  local_480.tail.super_ArrayIDFunc<int>._0_8_ =
       local_480.tail.super_ArrayIDFunc<int>._0_8_ & 0xffffffff00000000;
  tail.super_ArrayIDFunc<int>.data_ = local_480.tail.super_ArrayIDFunc<int>.data_;
  local_480.tail.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  tail.image_count_ = local_480.tail.image_count_;
  if (head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(head.super_ArrayIDFunc<int>.data_);
  }
  head.super_ArrayIDFunc<int>.preimage_count_ =
       local_480.head.super_ArrayIDFunc<int>.preimage_count_;
  local_480.head.super_ArrayIDFunc<int>._0_8_ =
       local_480.head.super_ArrayIDFunc<int>._0_8_ & 0xffffffff00000000;
  head.super_ArrayIDFunc<int>.data_ = local_480.head.super_ArrayIDFunc<int>.data_;
  local_480.head.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  head.image_count_ = local_480.head.image_count_;
  if ((local_480.tail.super_ArrayIDFunc<int>.data_ != (int *)0x0) &&
     (operator_delete__(local_480.tail.super_ArrayIDFunc<int>.data_),
     local_480.head.super_ArrayIDFunc<int>.data_ != (int *)0x0)) {
    operator_delete__(local_480.head.super_ArrayIDFunc<int>.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._0_8_ != &aStack_378) {
    operator_delete((void *)local_388._0_8_);
  }
  if (print_status == true) {
    std::__cxx11::to_string(&local_4c8,tail.image_count_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_4a8 + 8),"node_count = ",&local_4c8);
    plVar5 = (long *)std::__cxx11::string::append(local_4a8 + 8);
    local_4e8._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_4e8._M_dataplus._M_p == psVar8) {
      local_4e8.field_2._M_allocated_capacity = *psVar8;
      local_4e8.field_2._8_8_ = plVar5[3];
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    }
    else {
      local_4e8.field_2._M_allocated_capacity = *psVar8;
    }
    local_4e8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::to_string(&local_3e8,tail.super_ArrayIDFunc<int>.preimage_count_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388,
                   &local_4e8,&local_3e8);
    plVar5 = (long *)std::__cxx11::string::append(local_388);
    puVar6 = (undefined8 *)&local_480.head.image_count_;
    local_480.head.super_ArrayIDFunc<int>._0_8_ = *plVar5;
    plVar9 = plVar5 + 2;
    if ((long *)local_480.head.super_ArrayIDFunc<int>._0_8_ == plVar9) {
      local_480.head._16_8_ = *plVar9;
      local_480.tail.super_ArrayIDFunc<int>._0_8_ = plVar5[3];
      local_480.head.super_ArrayIDFunc<int>._0_8_ = puVar6;
    }
    else {
      local_480.head._16_8_ = *plVar9;
    }
    local_480.head.super_ArrayIDFunc<int>.data_ = (int *)plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._0_8_ != &aStack_378) {
      operator_delete((void *)local_388._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    write(2,(void *)local_480.head.super_ArrayIDFunc<int>._0_8_,
          (size_t)local_480.head.super_ArrayIDFunc<int>.data_);
    if ((undefined8 *)local_480.head.super_ArrayIDFunc<int>._0_8_ != puVar6) {
      operator_delete((void *)local_480.head.super_ArrayIDFunc<int>._0_8_);
    }
  }
  if ((print_status & 1U) != 0) {
    gettimeofday((timeval *)&local_480,(__timezone_ptr_t)0x0);
    program_start_milli_time =
         (ulong)local_480.head.super_ArrayIDFunc<int>.data_ / 1000 +
         local_480.head.super_ArrayIDFunc<int>._0_8_ * 1000;
  }
  iVar10 = tail.image_count_;
  local_4a8 = (undefined1  [8])(uVar7 + (uVar7 == 0));
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"greedy order","");
  compute_greedy_order(&local_480.head,&tail,&head);
  test_new_elimination_order(&local_90,&local_480.head);
  if (local_480.head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_480.head.super_ArrayIDFunc<int>.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (iVar10 < best_tree_depth * 0x14) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"refined bfs split in nested dissection","");
    local_1d0.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_;
    if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
      local_1d0.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    else {
      sVar11 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
      uVar7 = 0xffffffffffffffff;
      if (-1 < tail.super_ArrayIDFunc<int>.preimage_count_) {
        uVar7 = sVar11;
      }
      local_1d0.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar7);
      memmove(local_1d0.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar11);
    }
    local_1d0.image_count_ = tail.image_count_;
    local_188.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_;
    if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
      local_188.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    else {
      sVar11 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
      uVar7 = 0xffffffffffffffff;
      if (-1 < head.super_ArrayIDFunc<int>.preimage_count_) {
        uVar7 = sVar11;
      }
      local_188.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar7);
      memmove(local_188.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar11);
    }
    local_188.image_count_ = head.image_count_;
    local_388._0_8_ = local_4a8;
    compute_tree_depth_order<main::__0>
              (&local_480.head,&local_1d0,&local_188,(anon_class_8_1_f6d195b4 *)local_388,
               best_tree_depth + -1);
    test_new_elimination_order(&local_b0,&local_480.head);
    if (local_480.head.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_480.head.super_ArrayIDFunc<int>.data_);
    }
    if (local_188.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_188.super_ArrayIDFunc<int>.data_);
    }
    if (local_1d0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_1d0.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  local_480.head._16_8_ = 0;
  local_480.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
  local_480.tail.super_ArrayIDFunc<int>._4_4_ = 0;
  local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
  local_480.head.super_ArrayIDFunc<int>._0_8_ = (long)local_4a8 << 0x20;
  local_480.tail.super_ArrayIDFunc<int>.data_ =
       (int *)((ulong)local_480.tail.super_ArrayIDFunc<int>.data_ & 0xffffffff00000000);
  local_480.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar10);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_4a8 + 8),"random_seed","");
  flow_cutter::Config::get(&local_4e8,(Config *)&local_480,(string *)(local_4a8 + 8));
  std::operator+(&local_50,
                 "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed="
                 ,&local_4e8);
  local_1e8.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_;
  if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
    local_1e8.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    sVar11 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
    uVar7 = 0xffffffffffffffff;
    if (-1 < tail.super_ArrayIDFunc<int>.preimage_count_) {
      uVar7 = sVar11;
    }
    local_1e8.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar7);
    memmove(local_1e8.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar11);
  }
  local_1e8.image_count_ = tail.image_count_;
  local_1a0.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_;
  if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
    local_1a0.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    sVar11 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
    uVar7 = 0xffffffffffffffff;
    if (-1 < head.super_ArrayIDFunc<int>.preimage_count_) {
      uVar7 = sVar11;
    }
    local_1a0.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar7);
    memmove(local_1a0.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar11);
  }
  local_1a0.image_count_ = head.image_count_;
  local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
  local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
  local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
  aStack_378._M_allocated_capacity = local_480.head._16_8_;
  aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
  compute_tree_depth_order<flow_cutter::FastComputeSeparator>
            ((ArrayIDIDFunc *)&local_4c8,&local_1e8,&local_1a0,(FastComputeSeparator *)local_388,
             best_tree_depth + -1);
  test_new_elimination_order(&local_50,(ArrayIDIDFunc *)&local_4c8);
  if ((void *)local_4c8._M_string_length != (void *)0x0) {
    operator_delete__((void *)local_4c8._M_string_length);
  }
  if (local_1a0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_1a0.super_ArrayIDFunc<int>.data_);
  }
  if (local_1e8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_1e8.super_ArrayIDFunc<int>.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p);
  }
  local_480.head._16_8_ = 0;
  local_480.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
  local_480.tail.super_ArrayIDFunc<int>._4_4_ = 0;
  local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
  local_480.head.super_ArrayIDFunc<int>._0_8_ = (long)local_4a8 << 0x20;
  local_480.tail.super_ArrayIDFunc<int>.data_ =
       (int *)((ulong)local_480.tail.super_ArrayIDFunc<int>.data_ & 0xffffffff00000000);
  local_480.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar10);
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_4a8 + 8),"random_seed","");
  flow_cutter::Config::get(&local_4e8,(Config *)&local_480,(string *)(local_4a8 + 8));
  std::operator+(&local_70,
                 "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed="
                 ,&local_4e8);
  local_200.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_;
  if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
    local_200.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    sVar11 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
    uVar7 = 0xffffffffffffffff;
    if (-1 < tail.super_ArrayIDFunc<int>.preimage_count_) {
      uVar7 = sVar11;
    }
    local_200.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar7);
    memmove(local_200.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar11);
  }
  local_200.image_count_ = tail.image_count_;
  local_1b8.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_;
  if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
    local_1b8.super_ArrayIDFunc<int>.data_ = (int *)0x0;
  }
  else {
    sVar11 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
    uVar7 = 0xffffffffffffffff;
    if (-1 < head.super_ArrayIDFunc<int>.preimage_count_) {
      uVar7 = sVar11;
    }
    local_1b8.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(uVar7);
    memmove(local_1b8.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar11);
  }
  local_1b8.image_count_ = head.image_count_;
  local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
  local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
  local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
  aStack_378._M_allocated_capacity = local_480.head._16_8_;
  aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
  compute_tree_depth_order<flow_cutter::ComputeSeparator>
            ((ArrayIDIDFunc *)&local_4c8,&local_200,&local_1b8,(ComputeSeparator *)local_388,
             best_tree_depth + -1);
  test_new_elimination_order(&local_70,(ArrayIDIDFunc *)&local_4c8);
  if ((void *)local_4c8._M_string_length != (void *)0x0) {
    operator_delete__((void *)local_4c8._M_string_length);
  }
  if (local_1b8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_1b8.super_ArrayIDFunc<int>.data_);
  }
  if (local_200.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
    operator_delete__(local_200.super_ArrayIDFunc<int>.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p);
  }
  local_480.head._16_8_ = 0;
  local_480.tail.super_ArrayIDFunc<int>.preimage_count_ = 0;
  local_480.tail.super_ArrayIDFunc<int>._4_4_ = 0;
  local_480.head.super_ArrayIDFunc<int>.data_ = (int *)CONCAT44(0x3e4ccccd,iVar10);
  local_3ec = 0;
  uVar12 = 0;
  do {
    local_480.tail.super_ArrayIDFunc<int>.data_ =
         (int *)(CONCAT44(local_480.tail.super_ArrayIDFunc<int>.data_._4_4_,-(uVar12 & 1)) &
                0xffffffff00000003);
    local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
    local_480.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a8,0);
    local_480.head.super_ArrayIDFunc<int>.preimage_count_ = 1;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cutter_count","");
    flow_cutter::Config::get(&local_3a8,(Config *)&local_480,&local_410);
    std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_4c8.field_2._M_allocated_capacity = *psVar8;
      local_4c8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_4c8.field_2._M_allocated_capacity = *psVar8;
      local_4c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_4c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pierce_rating","");
    flow_cutter::Config::get(&local_3c8,(Config *)&local_480,&local_430);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_4a8 + 8),&local_4c8,&local_3c8);
    plVar5 = (long *)std::__cxx11::string::append(local_4a8 + 8);
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_4e8.field_2._M_allocated_capacity = *psVar8;
      local_4e8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_4e8.field_2._M_allocated_capacity = *psVar8;
      local_4e8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_4e8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"random_seed","");
    flow_cutter::Config::get(&local_360,(Config *)&local_480,&local_450);
    std::operator+(&local_d0,&local_4e8,&local_360);
    local_218.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_;
    if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
      local_218.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    else {
      sVar13 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
      sVar11 = sVar13;
      if (tail.super_ArrayIDFunc<int>.preimage_count_ < 0) {
        sVar11 = 0xffffffffffffffff;
      }
      local_218.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
      memmove(local_218.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar13);
    }
    local_218.image_count_ = tail.image_count_;
    local_230.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_;
    if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
      local_230.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    else {
      sVar13 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
      sVar11 = sVar13;
      if (head.super_ArrayIDFunc<int>.preimage_count_ < 0) {
        sVar11 = 0xffffffffffffffff;
      }
      local_230.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
      memmove(local_230.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar13);
    }
    local_230.image_count_ = head.image_count_;
    local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
    local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
    local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
    aStack_378._M_allocated_capacity = local_480.head._16_8_;
    aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
    compute_tree_depth_order<flow_cutter::ComputeSeparator>
              (&local_340,&local_218,&local_230,(ComputeSeparator *)local_388,best_tree_depth + -1);
    test_new_elimination_order(&local_d0,&local_340);
    if (local_340.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_340.super_ArrayIDFunc<int>.data_);
    }
    if (local_230.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_230.super_ArrayIDFunc<int>.data_);
    }
    if (local_218.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_218.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
    local_480.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a8,0);
    local_480.head.super_ArrayIDFunc<int>.preimage_count_ = 2;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cutter_count","");
    flow_cutter::Config::get(&local_3a8,(Config *)&local_480,&local_410);
    std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_3e8);
    local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_4c8.field_2._M_allocated_capacity = *psVar8;
      local_4c8.field_2._8_8_ = plVar5[3];
    }
    else {
      local_4c8.field_2._M_allocated_capacity = *psVar8;
      local_4c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_4c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pierce_rating","");
    flow_cutter::Config::get(&local_3c8,(Config *)&local_480,&local_430);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_4a8 + 8),&local_4c8,&local_3c8);
    puVar6 = (undefined8 *)std::__cxx11::string::append(local_4a8 + 8);
    local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
    psVar8 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_4e8.field_2._M_allocated_capacity = *psVar8;
      local_4e8.field_2._8_8_ = puVar6[3];
    }
    else {
      local_4e8.field_2._M_allocated_capacity = *psVar8;
      local_4e8._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_4e8._M_string_length = puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"random_seed","");
    flow_cutter::Config::get(&local_360,(Config *)&local_480,&local_450);
    std::operator+(&local_f0,&local_4e8,&local_360);
    local_248.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_;
    if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
      local_248.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    else {
      sVar13 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
      sVar11 = sVar13;
      if (tail.super_ArrayIDFunc<int>.preimage_count_ < 0) {
        sVar11 = 0xffffffffffffffff;
      }
      local_248.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
      memmove(local_248.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar13);
    }
    local_248.image_count_ = tail.image_count_;
    local_260.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_;
    if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
      local_260.super_ArrayIDFunc<int>.data_ = (int *)0x0;
    }
    else {
      sVar13 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
      sVar11 = sVar13;
      if (head.super_ArrayIDFunc<int>.preimage_count_ < 0) {
        sVar11 = 0xffffffffffffffff;
      }
      local_260.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
      memmove(local_260.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar13);
    }
    local_260.image_count_ = head.image_count_;
    local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
    local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
    local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
    aStack_378._M_allocated_capacity = local_480.head._16_8_;
    aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
    compute_tree_depth_order<flow_cutter::ComputeSeparator>
              (&local_340,&local_248,&local_260,(ComputeSeparator *)local_388,best_tree_depth + -1);
    test_new_elimination_order(&local_f0,&local_340);
    if (local_340.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_340.super_ArrayIDFunc<int>.data_);
    }
    if (local_260.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_260.super_ArrayIDFunc<int>.data_);
    }
    if (local_248.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
      operator_delete__(local_248.super_ArrayIDFunc<int>.data_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
      operator_delete(local_4c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
    if ((uVar12 / 3) * 3 + local_3ec != 0) {
      local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
      local_480.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a8,0);
      local_480.head.super_ArrayIDFunc<int>.preimage_count_ = 3;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cutter_count","");
      flow_cutter::Config::get(&local_3a8,(Config *)&local_480,&local_410);
      std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4c8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pierce_rating","");
      flow_cutter::Config::get(&local_3c8,(Config *)&local_480,&local_430);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a8 + 8),&local_4c8,&local_3c8);
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_4a8 + 8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4e8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"random_seed","");
      flow_cutter::Config::get(&local_360,(Config *)&local_480,&local_450);
      std::operator+(&local_110,&local_4e8,&local_360);
      local_278.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_278.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (tail.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_278.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_278.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_278.image_count_ = tail.image_count_;
      local_290.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_290.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (head.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_290.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_290.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_290.image_count_ = head.image_count_;
      local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
      local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
      local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
      aStack_378._M_allocated_capacity = local_480.head._16_8_;
      aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_278,&local_290,(ComputeSeparator *)local_388,best_tree_depth + -1
                );
      test_new_elimination_order(&local_110,&local_340);
      if (local_340.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_340.super_ArrayIDFunc<int>.data_);
      }
      if (local_290.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_290.super_ArrayIDFunc<int>.data_);
      }
      if (local_278.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_278.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p);
      }
    }
    if (0xf < uVar12 % 0x14) {
      local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
      local_480.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a8,0);
      local_480.head.super_ArrayIDFunc<int>.preimage_count_ = 0x14;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cutter_count","");
      flow_cutter::Config::get(&local_3a8,(Config *)&local_480,&local_410);
      std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4c8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pierce_rating","");
      flow_cutter::Config::get(&local_3c8,(Config *)&local_480,&local_430);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a8 + 8),&local_4c8,&local_3c8);
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_4a8 + 8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4e8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"random_seed","");
      flow_cutter::Config::get(&local_360,(Config *)&local_480,&local_450);
      std::operator+(&local_130,&local_4e8,&local_360);
      local_2a8.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_2a8.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (tail.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_2a8.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_2a8.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_2a8.image_count_ = tail.image_count_;
      local_2c0.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_2c0.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (head.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_2c0.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_2c0.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_2c0.image_count_ = head.image_count_;
      local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
      local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
      local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
      aStack_378._M_allocated_capacity = local_480.head._16_8_;
      aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_2a8,&local_2c0,(ComputeSeparator *)local_388,best_tree_depth + -1
                );
      test_new_elimination_order(&local_130,&local_340);
      if (local_340.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_340.super_ArrayIDFunc<int>.data_);
      }
      if (local_2c0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_2c0.super_ArrayIDFunc<int>.data_);
      }
      if (local_2a8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_2a8.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p);
      }
    }
    if (0x1e < uVar12 % 0x32) {
      local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
      local_480.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a8,0);
      local_480.head.super_ArrayIDFunc<int>.preimage_count_ = 0x28;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cutter_count","");
      flow_cutter::Config::get(&local_3a8,(Config *)&local_480,&local_410);
      std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4c8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pierce_rating","");
      flow_cutter::Config::get(&local_3c8,(Config *)&local_480,&local_430);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a8 + 8),&local_4c8,&local_3c8);
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_4a8 + 8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4e8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"random_seed","");
      flow_cutter::Config::get(&local_360,(Config *)&local_480,&local_450);
      std::operator+(&local_150,&local_4e8,&local_360);
      local_2d8.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_2d8.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (tail.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_2d8.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_2d8.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_2d8.image_count_ = tail.image_count_;
      local_2f0.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_2f0.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (head.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_2f0.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_2f0.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_2f0.image_count_ = head.image_count_;
      local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
      local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
      local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
      aStack_378._M_allocated_capacity = local_480.head._16_8_;
      aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_2d8,&local_2f0,(ComputeSeparator *)local_388,best_tree_depth + -1
                );
      test_new_elimination_order(&local_150,&local_340);
      if (local_340.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_340.super_ArrayIDFunc<int>.data_);
      }
      if (local_2f0.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_2f0.super_ArrayIDFunc<int>.data_);
      }
      if (local_2d8.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_2d8.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p);
      }
    }
    if (0x62 < uVar12 % 100) {
      local_4a8 = (undefined1  [8])((ulong)((long)local_4a8 * 0xbc8f) % 0x7fffffff);
      local_480.head.super_ArrayIDFunc<int>._4_4_ = SUB84(local_4a8,0);
      local_480.head.super_ArrayIDFunc<int>.preimage_count_ = 0x50;
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"cutter_count","");
      flow_cutter::Config::get(&local_3a8,(Config *)&local_480,&local_410);
      std::operator+(&local_3e8,"flowcutter cutter_count=",&local_3a8);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4c8.field_2._M_allocated_capacity = *psVar8;
        local_4c8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4c8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"pierce_rating","");
      flow_cutter::Config::get(&local_3c8,(Config *)&local_480,&local_430);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_4a8 + 8),&local_4c8,&local_3c8);
      puVar6 = (undefined8 *)std::__cxx11::string::append(local_4a8 + 8);
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      psVar8 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8.field_2._8_8_ = puVar6[3];
      }
      else {
        local_4e8.field_2._M_allocated_capacity = *psVar8;
        local_4e8._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_4e8._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"random_seed","");
      flow_cutter::Config::get(&local_360,(Config *)&local_480,&local_450);
      std::operator+(&local_170,&local_4e8,&local_360);
      local_308.super_ArrayIDFunc<int>.preimage_count_ = tail.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)tail.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_308.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)tail.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (tail.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_308.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_308.super_ArrayIDFunc<int>.data_,tail.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_308.image_count_ = tail.image_count_;
      local_320.super_ArrayIDFunc<int>.preimage_count_ = head.super_ArrayIDFunc<int>.preimage_count_
      ;
      if ((long)head.super_ArrayIDFunc<int>.preimage_count_ == 0) {
        local_320.super_ArrayIDFunc<int>.data_ = (int *)0x0;
      }
      else {
        sVar13 = (long)head.super_ArrayIDFunc<int>.preimage_count_ << 2;
        sVar11 = sVar13;
        if (head.super_ArrayIDFunc<int>.preimage_count_ < 0) {
          sVar11 = 0xffffffffffffffff;
        }
        local_320.super_ArrayIDFunc<int>.data_ = (int *)operator_new__(sVar11);
        memmove(local_320.super_ArrayIDFunc<int>.data_,head.super_ArrayIDFunc<int>.data_,sVar13);
      }
      local_320.image_count_ = head.image_count_;
      local_368 = (PierceRating)local_480.tail.super_ArrayIDFunc<int>.data_;
      local_388._0_8_ = local_480.head.super_ArrayIDFunc<int>._0_8_;
      local_388._8_8_ = local_480.head.super_ArrayIDFunc<int>.data_;
      aStack_378._M_allocated_capacity = local_480.head._16_8_;
      aStack_378._8_8_ = local_480.tail.super_ArrayIDFunc<int>._0_8_;
      compute_tree_depth_order<flow_cutter::ComputeSeparator>
                (&local_340,&local_308,&local_320,(ComputeSeparator *)local_388,best_tree_depth + -1
                );
      test_new_elimination_order(&local_170,&local_340);
      if (local_340.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_340.super_ArrayIDFunc<int>.data_);
      }
      if (local_320.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_320.super_ArrayIDFunc<int>.data_);
      }
      if (local_308.super_ArrayIDFunc<int>.data_ != (int *)0x0) {
        operator_delete__(local_308.super_ArrayIDFunc<int>.data_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
        operator_delete(local_4a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
        operator_delete(local_4c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p);
      }
    }
    uVar12 = uVar12 + 1;
    local_3ec = local_3ec + -1;
  } while( true );
}

Assistant:

int main(int argc, char* argv[])
{
    signal(SIGTERM, signal_handler);
    signal(SIGINT, signal_handler);
    signal(SIGSEGV, signal_handler);

    int random_seed = 0;

    try {
        {
            string input_file_name = "-";
            for (int i = 1; i < argc; ++i) {
                if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h")){
                    char msg[] = "Computes a tree depth decomposition given a graph. The graph is read by default from stdin in the PACE 2020 graph format. The output is written to stdout. Status messages can be written to stderr, if requested. By default, nothing is written to stderr. The program supports the following options:\n"
                    "  -h,--help Print this message and do nothing else\n"
                    "  --status  Print a message to stderr each time a\n"
                    "            better tree depth decomposition is found\n"
                    "  --verbose Print a message to stderr each time a tree\n"
                    "            depth decomposition was computed independent\n"
                    "            of whether it is better than the best one \n"
                    "            found so far\n"
                    "  -i <file> Instead of reading the graph from stdin,\n"
                    "            read it from <file>\n"
                    "  -s <seed> Use <seed> as seed for the random number\n"
                    "            generator. This must be an integer. The\n"
                    "            default seed is 0.\n";
                    ignore_return_value(write(STDERR_FILENO, msg, sizeof(msg)-1));
                    return 1;
                } else if (!strcmp(argv[i], "--verbose")) {
                    print_verbose_status = true;
                    print_status = true;
                } else if (!strcmp(argv[i], "--status")) {
                    print_status = true;
                } else if (!strcmp(argv[i], "-i") && i != argc - 1) {
                    ++i;
                    input_file_name = argv[i];
                } else if (!strcmp(argv[i], "-s") && i != argc - 1) {
                    ++i;
                    random_seed = atoi(argv[i]);
                }
            }

            auto g = uncached_load_pace_graph(input_file_name);
            tail = std::move(g.tail);
            head = std::move(g.head);
        }

        if (print_status) {
            string msg = "node_count = " + to_string(tail.image_count()) + " arc_count = " + to_string(tail.preimage_count()) + "\n";
            ignore_return_value(write(STDERR_FILENO, msg.data(), msg.length()));
        }

        if (print_status)
            program_start_milli_time = get_milli_time();

        const int node_count = tail.image_count();
                        
        #ifdef PARALLELIZE
        #pragma omp parallel
        #endif
        {
            try {
                std::minstd_rand rand_gen;
                rand_gen.seed(random_seed
                    #ifdef PARALLELIZE
                    + omp_get_thread_num()
                    #endif
                );

                #ifdef PARALLELIZE
                #pragma omp sections nowait
                #endif
                {
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        test_new_elimination_order("greedy order", compute_greedy_order(tail, head));

                        if(20*best_tree_depth > node_count)
                            test_new_elimination_order("refined bfs split in nested dissection", compute_tree_depth_order(
                                tail, head, 
                                [&](const ArrayIDIDFunc& tail, const ArrayIDIDFunc& head, int max_size) {
                                    return compute_separator_by_running_bfs(tail, head, max_size, rand_gen);
                                },
                                best_tree_depth - 1)
                            );
                    }

                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    {
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "edge flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::FastComputeSeparator(config),
                                best_tree_depth - 1));
                    }
                    #ifdef PARALLELIZE
                    #pragma omp section
                    #endif
                    { 
                        flow_cutter::Config config;
                        config.random_seed = rand_gen();
                        config.cutter_count = 0;
                        config.pierce_rating = flow_cutter::Config::PierceRating::max_target_minus_source_hop_dist;
                        config.max_cut_size = node_count;
                        test_new_elimination_order(
                            "flowcutter cutter_count=1 distant-source-target pierce_rating=max_target_minus_source_hop_dist random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1)
                        );
                    }
                }

                {
                    flow_cutter::Config config;
                    config.max_cut_size = node_count;

                    for (int i = 0;; ++i) {
                        
                        if (i % 2 == 0) {
                            config.pierce_rating = flow_cutter::Config::PierceRating::
                                max_target_minus_source_hop_dist;
                        } else {
                            config.pierce_rating = flow_cutter::Config::PierceRating::random;
                        }
                        
                        config.cutter_count = 1;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));


                        config.cutter_count = 2;
                        config.random_seed = rand_gen();
                        test_new_elimination_order(
                            "flowcutter"
                            " cutter_count="
                                + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                            compute_tree_depth_order(
                                tail, head,
                                flow_cutter::ComputeSeparator(config),
                                best_tree_depth - 1));

                        if((i%3)>0){
                                config.cutter_count = 3;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%20)>15){
                                config.cutter_count = 20;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%50)>30){
                                config.cutter_count = 40;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }

                        if((i%100)>98){
                                config.cutter_count = 80;
                                config.random_seed = rand_gen();
                                test_new_elimination_order(
                                    "flowcutter"
                                    " cutter_count="
                                        + config.get("cutter_count") + " pierce_rating=" + config.get("pierce_rating") + " random_seed=" + config.get("random_seed"),
                                    compute_tree_depth_order(
                                        tail, head,
                                        flow_cutter::ComputeSeparator(config),
                                        best_tree_depth - 1));
                        }
                    }
                }
            }
            catch (...)
            {
                signal_handler(0);
            }
        }
    }
    catch (...)
    {
        signal_handler(0);
    }
}